

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotation_angles.hpp
# Opt level: O0

Matrix<float,_3,_1,_0,_3,_1>
eos::fitting::tait_bryan_angles<float>
          (Matrix<float,_3,_3,_0,_3,_3> *rotation_matrix,Index axis_0,Index axis_1,Index axis_2)

{
  Scalar SVar1;
  Scalar *pSVar2;
  uchar *sig;
  Matrix<float,_3,_3,_0,_3,_3> *pMVar3;
  uchar *in_R8;
  size_t in_R9;
  ulong extraout_XMM0_Qa;
  ulong uVar4;
  float fVar5;
  Matrix<float,_3,_1,_0,_3,_1> MVar6;
  NestedExpressionType local_80;
  NestedExpressionType local_78;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> local_70 [20];
  float local_5c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sign_op<float,_false,_false>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
  local_58;
  Index axis_2_local;
  Index axis_1_local;
  Index axis_0_local;
  Matrix<float,_3,_3,_0,_3,_3> *rotation_matrix_local;
  Matrix<float,_3,_1,_0,_3,_1> *euler_angles;
  
  axis_2_local = axis_2;
  axis_1_local = axis_1;
  axis_0_local = axis_0;
  rotation_matrix_local = rotation_matrix;
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::eulerAngles
            ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)rotation_matrix,axis_0,axis_1,
             axis_2);
  pMVar3 = rotation_matrix;
  Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)rotation_matrix,1);
  std::abs((int)pMVar3);
  fVar5 = 1.5707964;
  uVar4 = extraout_XMM0_Qa;
  if (1.5707964 < (float)extraout_XMM0_Qa) {
    local_5c = 3.1415927;
    local_78 = (NestedExpressionType)
               Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::array
                         ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)rotation_matrix);
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>::sign
              (local_70,(EVP_PKEY_CTX *)&local_78,sig,(size_t *)axis_2,in_R8,in_R9);
    Eigen::operator*(&local_58,&local_5c,(StorageBaseType *)local_70);
    local_80 = (NestedExpressionType)
               Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::array
                         ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)rotation_matrix);
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,3,1,0,3,1>>>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,3,1,0,3,1>>> *)&local_80,
               (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sign_op<float,_false,_false>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>_>
                *)&local_58);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)rotation_matrix,1
                       );
    SVar1 = *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)rotation_matrix,1
                       );
    uVar4 = (ulong)(uint)-SVar1;
    *pSVar2 = -SVar1;
  }
  MVar6.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       fVar5;
  MVar6.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (float)(int)uVar4;
  MVar6.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (float)(int)(uVar4 >> 0x20);
  return (Matrix<float,_3,_1,_0,_3,_1>)
         MVar6.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
}

Assistant:

inline Eigen::Matrix<T, 3, 1> tait_bryan_angles(Eigen::Matrix<T, 3, 3> rotation_matrix, Eigen::Index axis_0,
                                                Eigen::Index axis_1, Eigen::Index axis_2)
{
    Eigen::Matrix<T, 3, 1> euler_angles = rotation_matrix.eulerAngles(axis_0, axis_1, axis_2);
    // Eigen::Matrix3X.eulerAngles() returns the solution where the first axis is constrained from 0 to PI.
    // This is not what we usually want in robotics; we want the other solution (there are two in the general
    // case) where the middle (pitch) axis is constrained to -PI/2 to PI/2. See
    // https://gitlab.com/libeigen/eigen/-/issues/2617#note_1298729055
    if (std::abs(euler_angles(1)) > T(core::pi<T> / 2.0))
    {
        euler_angles.array() -= T(core::pi<T>) * euler_angles.array().sign();
        euler_angles(1) = -euler_angles(1);
    }
    return euler_angles;
}